

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

bool __thiscall
duckdb::ColumnDataCollection::PrevScanIndex
          (ColumnDataCollection *this,ColumnDataScanState *state,idx_t *chunk_index,
          idx_t *segment_index,idx_t *row_index)

{
  ulong uVar1;
  const_reference pvVar2;
  pointer pCVar3;
  reference pvVar4;
  idx_t iVar5;
  size_type __n;
  
  while (uVar1 = state->chunk_index, uVar1 < 2) {
    if (state->segment_index == 0) goto LAB_012962a1;
    __n = state->segment_index - 1;
    state->segment_index = __n;
    pvVar2 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
             ::get<true>(&this->segments,__n);
    pCVar3 = unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
             ::operator->(pvVar2);
    state->chunk_index =
         ((long)(pCVar3->chunk_data).
                super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
                super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(pCVar3->chunk_data).
               super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
               super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x58 + 1;
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)state);
  }
  state->chunk_index = uVar1 - 1;
  *segment_index = state->segment_index;
  *chunk_index = state->chunk_index - 1;
  state->next_row_index = state->current_row_index;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
           ::get<true>(&this->segments,state->segment_index);
  pCVar3 = unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
           ::operator->(pvVar2);
  pvVar4 = vector<duckdb::ChunkMetaData,_true>::get<true>(&pCVar3->chunk_data,*chunk_index);
  iVar5 = state->current_row_index - (ulong)pvVar4->count;
  state->current_row_index = iVar5;
  *row_index = iVar5;
LAB_012962a1:
  return 1 < uVar1;
}

Assistant:

bool ColumnDataCollection::PrevScanIndex(ColumnDataScanState &state, idx_t &chunk_index, idx_t &segment_index,
                                         idx_t &row_index) const {
	// check within the current segment if we still have chunks to scan
	// Note that state.chunk_index is 1-indexed, with 0 as undefined.
	while (state.chunk_index <= 1) {
		if (!state.segment_index) {
			return false;
		}

		--state.segment_index;
		state.chunk_index = segments[state.segment_index]->chunk_data.size() + 1;
		state.current_chunk_state.handles.clear();
	}

	--state.chunk_index;
	segment_index = state.segment_index;
	chunk_index = state.chunk_index - 1;
	state.next_row_index = state.current_row_index;
	state.current_row_index -= segments[state.segment_index]->chunk_data[chunk_index].count;
	row_index = state.current_row_index;
	return true;
}